

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr-writer-test.cc
# Opt level: O3

void __thiscall
ExprWriterTest_WriteUnaryExpr_Test::~ExprWriterTest_WriteUnaryExpr_Test
          (ExprWriterTest_WriteUnaryExpr_Test *this)

{
  LogicalConstant *this_00;
  
  this_00 = &this[-1].super_ExprWriterTest.l0;
  mp::BasicExprFactory<std::allocator<char>_>::~BasicExprFactory
            ((BasicExprFactory<std::allocator<char>_> *)this);
  testing::Test::~Test((Test *)this_00);
  operator_delete(this_00,0x58);
  return;
}

Assistant:

TEST_F(ExprWriterTest, WriteUnaryExpr) {
  auto x1 = MakeVariable(0);
  CHECK_WRITE("-x1", MakeUnary(ex::MINUS, x1));
  CHECK_WRITE("abs(x1)", MakeUnary(ex::ABS, x1));
  CHECK_WRITE("floor(x1)", MakeUnary(ex::FLOOR, x1));
  CHECK_WRITE("ceil(x1)", MakeUnary(ex::CEIL, x1));
  CHECK_WRITE("sqrt(x1)", MakeUnary(ex::SQRT, x1));
  CHECK_WRITE("x1 ^ 2", MakeUnary(ex::POW2, x1));
  CHECK_WRITE("exp(x1)", MakeUnary(ex::EXP, x1));
  CHECK_WRITE("log(x1)", MakeUnary(ex::LOG, x1));
  CHECK_WRITE("log10(x1)", MakeUnary(ex::LOG10, x1));
  CHECK_WRITE("sin(x1)", MakeUnary(ex::SIN, x1));
  CHECK_WRITE("sinh(x1)", MakeUnary(ex::SINH, x1));
  CHECK_WRITE("cos(x1)", MakeUnary(ex::COS, x1));
  CHECK_WRITE("cosh(x1)", MakeUnary(ex::COSH, x1));
  CHECK_WRITE("tan(x1)", MakeUnary(ex::TAN, x1));
  CHECK_WRITE("tanh(x1)", MakeUnary(ex::TANH, x1));
  CHECK_WRITE("asin(x1)", MakeUnary(ex::ASIN, x1));
  CHECK_WRITE("asinh(x1)", MakeUnary(ex::ASINH, x1));
  CHECK_WRITE("acos(x1)", MakeUnary(ex::ACOS, x1));
  CHECK_WRITE("acosh(x1)", MakeUnary(ex::ACOSH, x1));
  CHECK_WRITE("atan(x1)", MakeUnary(ex::ATAN, x1));
  CHECK_WRITE("atanh(x1)", MakeUnary(ex::ATANH, x1));
}